

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

geto_result_type * __thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::geto(geto_result_type *__return_storage_ptr__,
      buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
      *this,descriptor<pstore::details::posix_descriptor_traits> *io)

{
  anon_class_1_0_00000001 local_52;
  uint8_t result;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<unsigned_char,__1L>::element_type>_>
  local_50;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_30;
  
  result = '\0';
  local_30 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::make_span<unsigned_char>(&result,1);
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::get_span<pstore::gsl::span<unsigned_char,_1l>>
            (&local_50,
             (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)this,io,(span<unsigned_char,__1L> *)&local_30);
  pstore::operator>>=(__return_storage_ptr__,&local_50,&local_52);
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::span<unsigned_char,_-1L>_>_>
  ::~error_or(&local_50);
  return __return_storage_ptr__;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::geto (IO io) -> geto_result_type {
            std::uint8_t result{};
            return get_span (io, gsl::make_span (&result, 1)) >>= [] (IO io2,
                                                                      byte_span const & sp) {
                return geto_result_type{in_place, io2,
                                        sp.size () == 1 ? just (sp[0]) : nothing<std::uint8_t> ()};
            };
        }